

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

int Sbd_ManFindCands(Sbd_Man_t *p,word *Cover,int nDivs)

{
  int Entry;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  Vec_Int_t *p_00;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong *puVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  int Order [64];
  int Ones [64];
  
  uVar2 = (ulong)(uint)nDivs;
  iVar12 = 3;
  uVar5 = 2;
  lVar14 = (long)nDivs;
  uVar1 = Cover[lVar14];
  if ((nDivs < 8) || (p->pPars->fCover != 0)) {
    p_00 = p->vDivSet;
    p_00->nSize = 0;
    uVar2 = 0;
    uVar10 = 0;
    if (0 < nDivs) {
      uVar10 = (ulong)(uint)nDivs;
    }
    for (; uVar10 != uVar2; uVar2 = uVar2 + 1) {
      if (Cover[uVar2] == uVar1) {
        uVar7 = (uint)uVar2;
        goto LAB_0045897a;
      }
    }
    puVar4 = Cover + 1;
    uVar2 = 0;
    while (uVar2 != uVar10) {
      uVar16 = uVar2 & 0xffffffff;
      puVar19 = puVar4;
      while( true ) {
        uVar7 = (int)uVar16 + 1;
        uVar16 = (ulong)uVar7;
        if (nDivs <= (int)uVar7) break;
        uVar6 = *puVar19;
        puVar19 = puVar19 + 1;
        if ((uVar6 | Cover[uVar2]) == uVar1) {
          iVar12 = (int)uVar2;
LAB_0045896c:
          Vec_IntPush(p_00,iVar12);
          p_00 = p->vDivSet;
          goto LAB_0045897a;
        }
      }
      puVar4 = puVar4 + 1;
      uVar2 = uVar2 + 1;
    }
    uVar2 = 1;
    uVar16 = 0;
    while (uVar16 != uVar10) {
      iVar15 = (int)uVar5;
      uVar6 = uVar2;
      while (iVar12 = (int)uVar6, iVar12 < nDivs) {
        puVar4 = Cover + uVar5;
        uVar8 = uVar6 & 0xffffffff;
        while( true ) {
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
          if (nDivs <= (int)uVar7) break;
          uVar13 = *puVar4;
          puVar4 = puVar4 + 1;
          if ((Cover[uVar6] | Cover[uVar16] | uVar13) == uVar1) {
            Vec_IntPush(p_00,(int)uVar16);
            p_00 = p->vDivSet;
            goto LAB_0045896c;
          }
        }
        uVar5 = (ulong)((int)uVar5 + 1);
        uVar6 = uVar6 + 1;
      }
      uVar5 = (ulong)(iVar15 + 1);
      uVar2 = uVar2 + 1;
      uVar16 = uVar16 + 1;
    }
    iVar12 = 3;
    uVar7 = 2;
    lVar21 = 1;
    uVar5 = 0;
    while (uVar5 != uVar10) {
      lVar20 = lVar21;
      iVar15 = iVar12;
      uVar22 = uVar7;
      while( true ) {
        if (nDivs <= (int)lVar20) break;
        uVar2 = (ulong)uVar22;
        iVar11 = iVar15;
        while ((int)uVar2 < nDivs) {
          for (lVar18 = (long)iVar11; lVar18 < lVar14; lVar18 = lVar18 + 1) {
            if ((Cover[lVar20] | Cover[uVar5] | Cover[uVar2] | Cover[lVar18]) == uVar1) {
              Vec_IntPush(p_00,(int)uVar5);
              Vec_IntPush(p->vDivSet,(int)lVar20);
              Vec_IntPush(p->vDivSet,(int)uVar2);
              p_00 = p->vDivSet;
              uVar7 = (uint)lVar18;
              goto LAB_0045897a;
            }
          }
          iVar11 = iVar11 + 1;
          uVar2 = uVar2 + 1;
        }
        iVar15 = iVar15 + 1;
        uVar22 = uVar22 + 1;
        lVar20 = lVar20 + 1;
      }
      iVar12 = iVar12 + 1;
      uVar7 = uVar7 + 1;
      lVar21 = lVar21 + 1;
      uVar5 = uVar5 + 1;
    }
  }
  else {
    p_00 = p->vDivSet;
    p_00->nSize = 0;
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      if (Cover[uVar5] == uVar1) {
        uVar7 = (uint)uVar5;
LAB_0045897a:
        Vec_IntPush(p_00,uVar7);
        return 1;
      }
    }
    puVar4 = Cover + 1;
    uVar5 = 0;
    while (uVar5 != uVar2) {
      uVar10 = uVar5 & 0xffffffff;
      puVar19 = puVar4;
      while( true ) {
        uVar7 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar7;
        if (nDivs <= (int)uVar7) break;
        uVar16 = *puVar19;
        puVar19 = puVar19 + 1;
        if ((uVar16 | Cover[uVar5]) == uVar1) {
          Vec_IntPush(p_00,(int)uVar5);
          p_00 = p->vDivSet;
          goto LAB_0045897a;
        }
      }
      puVar4 = puVar4 + 1;
      uVar5 = uVar5 + 1;
    }
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      uVar10 = Cover[uVar5] - (Cover[uVar5] >> 1 & 0x5555555555555555);
      uVar10 = (uVar10 >> 2 & 0x3333333333333333) + (uVar10 & 0x3333333333333333);
      uVar10 = (uVar10 >> 4) + uVar10 & 0xf0f0f0f0f0f0f0f;
      uVar10 = (uVar10 >> 8) + uVar10;
      lVar21 = (uVar10 >> 0x10) + uVar10;
      Ones[uVar5] = (int)((ulong)lVar21 >> 0x20) + (int)lVar21 & 0xff;
    }
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      Order[uVar5] = (int)uVar5;
    }
    uVar5 = 1;
    for (uVar10 = 0; uVar10 != nDivs - 1; uVar10 = uVar10 + 1) {
      uVar6 = uVar10 & 0xffffffff;
      for (uVar16 = uVar5; iVar15 = (int)uVar6, uVar2 != uVar16; uVar16 = uVar16 + 1) {
        uVar8 = uVar16 & 0xffffffff;
        if (Ones[uVar16] <= Ones[iVar15]) {
          uVar8 = uVar6;
        }
        uVar6 = uVar8;
      }
      iVar11 = Order[uVar10];
      Order[uVar10] = Order[iVar15];
      iVar9 = Ones[uVar10];
      Ones[uVar10] = Ones[iVar15];
      Order[iVar15] = iVar11;
      Ones[iVar15] = iVar9;
      uVar5 = uVar5 + 1;
    }
    uVar6 = (ulong)(nDivs / 2 + 3);
    uVar8 = (ulong)(nDivs / 3 + 2);
    uVar16 = (ulong)(nDivs / 4 + 1);
    uVar5 = 2;
    uVar2 = 1;
    uVar10 = 0;
    while (uVar10 != uVar16) {
      uVar13 = uVar5;
      uVar17 = uVar2;
      while (uVar17 < uVar8) {
        uVar3 = uVar13;
        while (uVar3 < uVar6) {
          iVar15 = Order[uVar17];
          uVar7 = Order[uVar3];
          uVar3 = uVar3 + 1;
          if ((Cover[iVar15] | Cover[Order[uVar10]] | Cover[(int)uVar7]) == uVar1) {
            Vec_IntPush(p_00,Order[uVar10]);
LAB_00458c5b:
            Vec_IntPush(p->vDivSet,iVar15);
            p_00 = p->vDivSet;
            goto LAB_0045897a;
          }
        }
        uVar13 = uVar13 + 1;
        uVar17 = uVar17 + 1;
      }
      uVar5 = uVar5 + 1;
      uVar2 = uVar2 + 1;
      uVar10 = uVar10 + 1;
    }
    uVar5 = 2;
    uVar2 = 1;
    uVar10 = 0;
    while (uVar10 != uVar16) {
      uVar13 = uVar5;
      uVar17 = uVar2;
      iVar11 = iVar12;
      while (uVar17 < uVar8) {
        uVar3 = uVar13;
        iVar9 = iVar11;
        while (uVar3 < uVar6) {
          lVar21 = (long)iVar9;
          while (lVar21 < lVar14) {
            Entry = Order[uVar17];
            iVar15 = Order[uVar3];
            uVar7 = Order[lVar21];
            lVar21 = lVar21 + 1;
            if ((Cover[Entry] | Cover[Order[uVar10]] | Cover[iVar15] | Cover[(int)uVar7]) == uVar1)
            {
              Vec_IntPush(p_00,Order[uVar10]);
              Vec_IntPush(p->vDivSet,Entry);
              goto LAB_00458c5b;
            }
          }
          iVar9 = iVar9 + 1;
          uVar3 = uVar3 + 1;
        }
        iVar11 = iVar11 + 1;
        uVar13 = uVar13 + 1;
        uVar17 = uVar17 + 1;
      }
      iVar12 = iVar12 + 1;
      uVar5 = uVar5 + 1;
      uVar2 = uVar2 + 1;
      uVar10 = uVar10 + 1;
    }
  }
  return 0;
}

Assistant:

static inline int Sbd_ManFindCands( Sbd_Man_t * p, word Cover[64], int nDivs )
{
    int Ones[64], Order[64];
    int Limits[4] = { nDivs/4+1, nDivs/3+2, nDivs/2+3, nDivs };
    int c0, c1, c2, c3;
    word Target = Cover[nDivs];

    if ( nDivs < 8 || p->pPars->fCover )
        return Sbd_ManFindCandsSimple( p, Cover, nDivs );

    Vec_IntClear( p->vDivSet );
    for ( c0 = 0; c0 < nDivs; c0++ )
        if ( Cover[c0] == Target )
        {
            Vec_IntPush( p->vDivSet, c0 );
            return 1;
        }

    for ( c0 = 0;    c0 < nDivs; c0++ )
    for ( c1 = c0+1; c1 < nDivs; c1++ )
        if ( (Cover[c0] | Cover[c1]) == Target )
        {
            Vec_IntPush( p->vDivSet, c0 );
            Vec_IntPush( p->vDivSet, c1 );
            return 1;
        }

    // count ones
    for ( c0 = 0; c0 < nDivs; c0++ )
        Ones[c0] = Abc_TtCountOnes( Cover[c0] );

    // sort by the number of ones
    for ( c0 = 0; c0 < nDivs; c0++ )
        Order[c0] = c0;
    Vec_IntSelectSortCost2Reverse( Order, nDivs, Ones );

    // sort with limits
    for ( c0 = 0;    c0 < Limits[0]; c0++ )
    for ( c1 = c0+1; c1 < Limits[1]; c1++ )
    for ( c2 = c1+1; c2 < Limits[2]; c2++ )
        if ( (Cover[Order[c0]] | Cover[Order[c1]] | Cover[Order[c2]]) == Target )
        {
            Vec_IntPush( p->vDivSet, Order[c0] );
            Vec_IntPush( p->vDivSet, Order[c1] );
            Vec_IntPush( p->vDivSet, Order[c2] );
            return 1;
        }

    for ( c0 = 0;    c0 < Limits[0]; c0++ )
    for ( c1 = c0+1; c1 < Limits[1]; c1++ )
    for ( c2 = c1+1; c2 < Limits[2]; c2++ )
    for ( c3 = c2+1; c3 < Limits[3]; c3++ )
    {
        if ( (Cover[Order[c0]] | Cover[Order[c1]] | Cover[Order[c2]] | Cover[Order[c3]]) == Target )
        {
            Vec_IntPush( p->vDivSet, Order[c0] );
            Vec_IntPush( p->vDivSet, Order[c1] );
            Vec_IntPush( p->vDivSet, Order[c2] );
            Vec_IntPush( p->vDivSet, Order[c3] );
            return 1;
        }
    }
    return 0;
}